

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::ContentEncoding::~ContentEncoding(ContentEncoding *this)

{
  ContentCompression **ppCVar1;
  ContentCompression *pCVar2;
  ContentEncryption **ppCVar3;
  ContentEncryption *this_00;
  ContentCompression **ppCVar4;
  ContentEncryption **ppCVar5;
  
  ppCVar4 = this->compression_entries_;
  ppCVar1 = this->compression_entries_end_;
  if (ppCVar4 != ppCVar1) {
    do {
      pCVar2 = *ppCVar4;
      if ((pCVar2 != (ContentCompression *)0x0) && (pCVar2->settings != (uchar *)0x0)) {
        operator_delete__(pCVar2->settings);
      }
      ppCVar4 = ppCVar4 + 1;
      operator_delete(pCVar2);
    } while (ppCVar4 != ppCVar1);
    ppCVar4 = this->compression_entries_;
  }
  if (ppCVar4 != (ContentCompression **)0x0) {
    operator_delete__(ppCVar4);
  }
  ppCVar5 = this->encryption_entries_;
  ppCVar3 = this->encryption_entries_end_;
  if (ppCVar5 != ppCVar3) {
    do {
      this_00 = *ppCVar5;
      if (this_00 != (ContentEncryption *)0x0) {
        ContentEncryption::~ContentEncryption(this_00);
      }
      ppCVar5 = ppCVar5 + 1;
      operator_delete(this_00);
    } while (ppCVar5 != ppCVar3);
    ppCVar5 = this->encryption_entries_;
  }
  if (ppCVar5 != (ContentEncryption **)0x0) {
    operator_delete__(ppCVar5);
    return;
  }
  return;
}

Assistant:

ContentEncoding::~ContentEncoding() {
  ContentCompression** comp_i = compression_entries_;
  ContentCompression** const comp_j = compression_entries_end_;

  while (comp_i != comp_j) {
    ContentCompression* const comp = *comp_i++;
    delete comp;
  }

  delete[] compression_entries_;

  ContentEncryption** enc_i = encryption_entries_;
  ContentEncryption** const enc_j = encryption_entries_end_;

  while (enc_i != enc_j) {
    ContentEncryption* const enc = *enc_i++;
    delete enc;
  }

  delete[] encryption_entries_;
}